

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrixCorotation.cpp
# Opt level: O2

void chrono::fea::ChMatrixCorotation::ComputeKCt
               (ChMatrixConstRef K,ChMatrix33<double> *R,int nblocks,ChMatrixRef *KC)

{
  undefined1 auVar1 [16];
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  ulong uVar4;
  long lVar5;
  int col;
  long col_00;
  int rowres;
  long row_00;
  int row;
  long row_01;
  CoeffReturnType CVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Scalar local_60;
  
  lVar5 = 0;
  for (uVar4 = 0; uVar4 != (uint)(~(nblocks >> 0x1f) & nblocks); uVar4 = uVar4 + 1) {
    for (row_00 = 0;
        row_00 < (int)(K->
                      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                      ).
                      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      .m_rows.m_value; row_00 = row_00 + 1) {
      for (row_01 = 0; row_01 != 3; row_01 = row_01 + 1) {
        col_00 = 0;
        local_60 = 0.0;
        while (col_00 != 3) {
          CVar6 = Eigen::
                  DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
                  ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                *)K,row_00,lVar5 + col_00);
          pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)R,row_01,
                              col_00);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_60;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = CVar6;
          col_00 = col_00 + 1;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *pdVar2;
          auVar1 = vfmadd231sd_fma(auVar7,auVar8,auVar1);
          local_60 = auVar1._0_8_;
        }
        pSVar3 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)KC,row_00,row_01 + uVar4 * 3);
        *pSVar3 = local_60;
      }
    }
    lVar5 = lVar5 + 3;
  }
  return;
}

Assistant:

void ChMatrixCorotation::ComputeKCt(ChMatrixConstRef K,     // matrix to corotate
                                    const ChMatrix33<>& R,  // 3x3 rotation matrix (will be used transposed)
                                    const int nblocks,      // number of rotation blocks
                                    ChMatrixRef KC          // result matrix: C*K
) {
    for (int iblock = 0; iblock < nblocks; iblock++) {
        double sum;
        for (int rowres = 0; rowres < (int)K.rows(); ++rowres)
            for (int row = 0; row < 3; ++row) {
                sum = 0;
                for (int col = 0; col < 3; ++col)
                    sum += K(rowres, col + (3 * iblock)) * R(row, col);
                KC(rowres, row + (3 * iblock)) = sum;
            }
    }
}